

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::Begin
          (ByteCodeGenerator *this,ArenaAllocator *alloc,uint32 grfscr,
          ParseableFunctionInfo *pRootFunc)

{
  bool bVar1;
  FunctionBody *pFVar2;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  DListNode<JumpCleanupInfo> *pDVar4;
  
  this->alloc = alloc;
  this->flags = grfscr;
  this->pRootFunc = pRootFunc;
  if (pRootFunc != (ParseableFunctionInfo *)0x0) {
    pFVar2 = Js::FunctionProxy::GetFunctionBody(&pRootFunc->super_FunctionProxy);
    this->pCurrentFunction = pFVar2;
    if ((pFVar2 == (FunctionBody *)0x0) ||
       (((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 0x10) == 0))
    goto LAB_0077d0ae;
    bVar1 = IsInNonDebugMode(this);
    if (!bVar1) goto LAB_0077d0ae;
  }
  this->pCurrentFunction = (FunctionBody *)0x0;
LAB_0077d0ae:
  this->currentBlock = (ParseNodeBlock *)0x0;
  this->currentScope = (Scope *)0x0;
  this->globalScope = (Scope *)0x0;
  this->isBinding = true;
  this->inPrologue = false;
  this->maxAstSize = 0;
  this->loopDepth = 0;
  this->envDepth = 0;
  this->trackEnvDepth = false;
  this->funcEscapes = false;
  this->funcInfosToFinalize = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  pSVar3 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
           new<Memory::ArenaAllocator>(0x18,alloc,0x35916e);
  (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar3;
  (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count = 0
  ;
  pSVar3->allocator = alloc;
  this->funcInfoStack = pSVar3;
  pDVar4 = (DListNode<JumpCleanupInfo> *)new<Memory::ArenaAllocator>(0x20,alloc,0x35916e);
  (((DListBase<JumpCleanupInfo,_RealCount> *)&pDVar4->super_DListNodeBase<JumpCleanupInfo>)->
  super_DListNodeBase<JumpCleanupInfo>).next.list = (DListBase<JumpCleanupInfo,_RealCount> *)pDVar4;
  (((DListBase<JumpCleanupInfo,_RealCount> *)&pDVar4->super_DListNodeBase<JumpCleanupInfo>)->
  super_DListNodeBase<JumpCleanupInfo>).prev.node = pDVar4;
  *(undefined4 *)&(pDVar4->data).loopNode = 0;
  *(ArenaAllocator **)&(pDVar4->data).loopId = alloc;
  this->jumpCleanupList = (JumpCleanupList *)pDVar4;
  return;
}

Assistant:

void ByteCodeGenerator::Begin(
    __in ArenaAllocator *alloc,
    __in uint32 grfscr,
    __in Js::ParseableFunctionInfo* pRootFunc)
{
    this->alloc = alloc;
    this->flags = grfscr;
    this->pRootFunc = pRootFunc;
    this->pCurrentFunction = pRootFunc ? pRootFunc->GetFunctionBody() : nullptr;
    if (this->pCurrentFunction && this->pCurrentFunction->GetIsGlobalFunc() && IsInNonDebugMode())
    {
        // This is the deferred parse case (not due to debug mode), in which case the global function will not be marked to compiled again.
        this->pCurrentFunction = nullptr;
    }

    this->globalScope = nullptr;
    this->currentScope = nullptr;
    this->currentBlock = nullptr;
    this->isBinding = true;
    this->inPrologue = false;
    this->funcEscapes = false;
    this->maxAstSize = 0;
    this->loopDepth = 0;
    this->envDepth = 0;
    this->trackEnvDepth = false;
    this->funcInfosToFinalize = nullptr;

    this->funcInfoStack = Anew(alloc, SList<FuncInfo*>, alloc);
    this->jumpCleanupList = Anew(alloc, JumpCleanupList, alloc);
}